

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

opj_image_t * tgatoimage(char *filename,opj_cparameters_t *parameters)

{
  int iVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  opj_image_comp_t *poVar4;
  bool bVar5;
  FILE *__stream;
  size_t sVar6;
  void *__ptr;
  opj_image_t *poVar7;
  FILE *pFVar8;
  long lVar9;
  uint unaff_EBX;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  uint uVar13;
  undefined8 unaff_RBP;
  uint uVar14;
  ulong unaff_R12;
  uint uVar15;
  ulong uVar16;
  undefined8 uVar17;
  char ch;
  uchar b;
  uchar g;
  uchar a;
  opj_image_cmptparm_t cmptparm [4];
  byte local_f8;
  byte local_f7;
  byte local_f6;
  byte local_f5;
  uint local_f4;
  ulong local_f0;
  FILE *local_e8;
  FILE *local_e0;
  char *local_d8;
  opj_cparameters_t *local_d0;
  byte local_c8 [4];
  undefined4 uStack_c4;
  uint uStack_c0;
  ushort local_bc;
  ushort local_ba;
  byte local_b8;
  byte local_b7;
  undefined8 uStack_b0;
  undefined4 auStack_a8 [30];
  
  local_d8 = filename;
  local_d0 = parameters;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",local_d8);
    return (opj_image_t *)0x0;
  }
  pFVar8 = __stream;
  sVar6 = fread(local_c8,0x12,1,__stream);
  if (sVar6 != 1) {
    tgatoimage_cold_1();
    bVar5 = true;
    uVar12 = 0;
    local_e0 = pFVar8;
    goto LAB_001095c2;
  }
  uVar16 = (ulong)local_c8[0];
  local_f0 = (ulong)local_bc;
  local_e0 = (FILE *)(ulong)local_ba;
  local_f4 = (uint)local_b8;
  local_e8 = __stream;
  if (uVar16 == 0) {
LAB_00109590:
    __stream = local_e8;
    if (local_c8[2] < 9) {
      uVar12 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),(local_b7 & 0x20) == 0);
      if ((uint)uStack_c4._1_2_ * (uint)(uStack_c4._3_1_ >> 3) == 0) {
        bVar5 = false;
        unaff_R12 = local_f0;
        unaff_EBX = local_f4;
      }
      else {
        tgatoimage_cold_4();
        bVar5 = false;
        unaff_R12 = local_f0;
        unaff_EBX = local_f4;
      }
      goto LAB_001095c2;
    }
    tgatoimage_cold_5();
  }
  else {
    __ptr = malloc(uVar16);
    if (__ptr == (void *)0x0) {
      tgatoimage_cold_3();
    }
    else {
      sVar6 = fread(__ptr,uVar16,1,local_e8);
      if (sVar6 != 0) {
        free(__ptr);
        goto LAB_00109590;
      }
      tgatoimage_cold_2();
    }
  }
  bVar5 = true;
  uVar12 = 0;
  unaff_R12 = local_f0;
  __stream = local_e8;
  unaff_EBX = local_f4;
LAB_001095c2:
  if ((!bVar5) && ((unaff_EBX == 0x18 || (unaff_EBX == 0x20)))) {
    memset(local_c8,0,0x90);
    if ((unaff_EBX == 0x10) || (unaff_EBX == 8)) {
      uVar15 = ((unaff_EBX - 0x10 & 0xffffffef) == 0) + 1;
      uVar17 = 2;
    }
    else {
      uVar15 = (unaff_EBX == 0x20) + 3;
      uVar17 = 1;
    }
    local_e8 = (FILE *)CONCAT44(local_e8._4_4_,uVar15);
    uVar14 = (uint)unaff_R12;
    if (((int)local_e0 != 0) &&
       ((uint)((10000000 / ((ulong)local_e0 & 0xffffffff)) / (ulong)uVar15) < uVar14)) {
      uVar16 = (ulong)uVar15 * ((ulong)local_e0 & 0xffffffff) * (unaff_R12 & 0xffffffff);
      local_f0 = ftell(__stream);
      if (0x7ffffffe < uVar16) {
        uVar16 = 0x7fffffff;
      }
      fseek(__stream,uVar16 - 1,0);
      sVar6 = fread(&local_f8,1,1,__stream);
      if (sVar6 != 1) {
        fclose(__stream);
        return (opj_image_t *)0x0;
      }
      fseek(__stream,local_f0,0);
    }
    pFVar8 = local_e0;
    local_f0 = CONCAT44(local_f0._4_4_,uVar12);
    iVar11 = local_d0->subsampling_dx;
    iVar1 = local_d0->subsampling_dy;
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&uStack_b0 + lVar9) = 0x800000008;
      *(undefined4 *)((long)auStack_a8 + lVar9) = 0;
      *(int *)(local_c8 + lVar9) = iVar11;
      *(int *)((long)&uStack_c4 + lVar9) = iVar1;
      *(uint *)((long)&uStack_c0 + lVar9) = uVar14;
      iVar10 = (int)local_e0;
      *(int *)((long)&local_bc + lVar9) = iVar10;
      lVar9 = lVar9 + 0x24;
    } while ((ulong)uVar15 * 0x24 != lVar9);
    poVar7 = (opj_image_t *)opj_image_create((ulong)local_e8 & 0xffffffff,local_c8,uVar17);
    if (poVar7 != (opj_image_t *)0x0) {
      OVar2 = local_d0->image_offset_x0;
      poVar7->x0 = OVar2;
      OVar3 = local_d0->image_offset_y0;
      poVar7->y0 = OVar3;
      poVar7->x1 = OVar2 + 1 + iVar11 * (uVar14 - 1);
      poVar7->y1 = OVar3 + iVar1 * (iVar10 + -1) + 1;
      if (iVar10 != 0) {
        uVar15 = 0;
        do {
          uVar13 = ~uVar15 + (int)pFVar8;
          if ((char)local_f0 == '\0') {
            uVar13 = uVar15;
          }
          iVar11 = uVar13 * uVar14;
          if ((int)local_e8 == 3) {
            uVar16 = unaff_R12 & 0xffffffff;
            uVar13 = uVar14;
            while (uVar13 != 0) {
              sVar6 = fread(&local_f7,1,1,__stream);
              if (sVar6 == 0) {
                tgatoimage_cold_12();
LAB_001099d8:
                bVar5 = false;
              }
              else {
                sVar6 = fread(&local_f6,1,1,__stream);
                if (sVar6 == 0) {
                  tgatoimage_cold_11();
                  goto LAB_001099d8;
                }
                sVar6 = fread(&local_f8,1,1,__stream);
                if (sVar6 == 0) {
                  tgatoimage_cold_10();
                  goto LAB_001099d8;
                }
                poVar4 = poVar7->comps;
                poVar4->data[iVar11] = (uint)local_f8;
                poVar4[1].data[iVar11] = (uint)local_f6;
                poVar4[2].data[iVar11] = (uint)local_f7;
                iVar11 = iVar11 + 1;
                bVar5 = true;
              }
              if (!bVar5) {
                return (opj_image_t *)0x0;
              }
              uVar13 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar13;
            }
          }
          else if ((int)local_e8 == 4) {
            uVar16 = unaff_R12 & 0xffffffff;
            uVar13 = uVar14;
            while (uVar13 != 0) {
              sVar6 = fread(&local_f7,1,1,__stream);
              if (sVar6 == 0) {
                tgatoimage_cold_9();
LAB_001098fb:
                bVar5 = false;
              }
              else {
                sVar6 = fread(&local_f6,1,1,__stream);
                if (sVar6 == 0) {
                  tgatoimage_cold_8();
                  goto LAB_001098fb;
                }
                sVar6 = fread(&local_f8,1,1,__stream);
                if (sVar6 == 0) {
                  tgatoimage_cold_7();
                  goto LAB_001098fb;
                }
                sVar6 = fread(&local_f5,1,1,__stream);
                if (sVar6 == 0) {
                  tgatoimage_cold_6();
                  goto LAB_001098fb;
                }
                poVar4 = poVar7->comps;
                poVar4->data[iVar11] = (uint)local_f8;
                poVar4[1].data[iVar11] = (uint)local_f6;
                poVar4[2].data[iVar11] = (uint)local_f7;
                poVar4[3].data[iVar11] = (uint)local_f5;
                iVar11 = iVar11 + 1;
                bVar5 = true;
              }
              if (!bVar5) {
                return (opj_image_t *)0x0;
              }
              uVar13 = (int)uVar16 - 1;
              uVar16 = (ulong)uVar13;
            }
          }
          else {
            fprintf(_stderr,"Currently unsupported bit depth : %s\n",local_d8);
          }
          uVar15 = uVar15 + 1;
          pFVar8 = local_e0;
        } while (uVar15 != (uint)local_e0);
      }
      fclose(__stream);
      return poVar7;
    }
  }
  fclose(__stream);
  return (opj_image_t *)0x0;
}

Assistant:

opj_image_t* tgatoimage(const char *filename, opj_cparameters_t *parameters)
{
    FILE *f;
    opj_image_t *image;
    unsigned int image_width, image_height, pixel_bit_depth;
    unsigned int x, y;
    int flip_image = 0;
    opj_image_cmptparm_t cmptparm[4];   /* maximum 4 components */
    int numcomps;
    OPJ_COLOR_SPACE color_space;
    OPJ_BOOL mono ;
    OPJ_BOOL save_alpha;
    int subsampling_dx, subsampling_dy;
    int i;

    f = fopen(filename, "rb");
    if (!f) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return 0;
    }

    if (!tga_readheader(f, &pixel_bit_depth, &image_width, &image_height,
                        &flip_image)) {
        fclose(f);
        return NULL;
    }

    /* We currently only support 24 & 32 bit tga's ... */
    if (!((pixel_bit_depth == 24) || (pixel_bit_depth == 32))) {
        fclose(f);
        return NULL;
    }

    /* initialize image components */
    memset(&cmptparm[0], 0, 4 * sizeof(opj_image_cmptparm_t));

    mono = (pixel_bit_depth == 8) ||
           (pixel_bit_depth == 16);  /* Mono with & without alpha. */
    save_alpha = (pixel_bit_depth == 16) ||
                 (pixel_bit_depth == 32); /* Mono with alpha, or RGB with alpha */

    if (mono) {
        color_space = OPJ_CLRSPC_GRAY;
        numcomps = save_alpha ? 2 : 1;
    } else {
        numcomps = save_alpha ? 4 : 3;
        color_space = OPJ_CLRSPC_SRGB;
    }

    /* If the declared file size is > 10 MB, check that the file is big */
    /* enough to avoid excessive memory allocations */
    if (image_height != 0 &&
            image_width > 10000000U / image_height / (OPJ_UINT32)numcomps) {
        char ch;
        OPJ_UINT64 expected_file_size =
            (OPJ_UINT64)image_width * image_height * (OPJ_UINT32)numcomps;
        long curpos = ftell(f);
        if (expected_file_size > (OPJ_UINT64)INT_MAX) {
            expected_file_size = (OPJ_UINT64)INT_MAX;
        }
        fseek(f, (long)expected_file_size - 1, SEEK_SET);
        if (fread(&ch, 1, 1, f) != 1) {
            fclose(f);
            return NULL;
        }
        fseek(f, curpos, SEEK_SET);
    }

    subsampling_dx = parameters->subsampling_dx;
    subsampling_dy = parameters->subsampling_dy;

    for (i = 0; i < numcomps; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].bpp = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[i].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[i].w = image_width;
        cmptparm[i].h = image_height;
    }

    /* create the image */
    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);

    if (!image) {
        fclose(f);
        return NULL;
    }


    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = !image->x0 ? (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1 : image->x0 + (OPJ_UINT32)(image_width - 1)  *
                (OPJ_UINT32)subsampling_dx + 1;
    image->y1 = !image->y0 ? (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1 : image->y0 + (OPJ_UINT32)(image_height - 1) *
                (OPJ_UINT32)subsampling_dy + 1;

    /* set image data */
    for (y = 0; y < image_height; y++) {
        int index;

        if (flip_image) {
            index = (int)((image_height - y - 1) * image_width);
        } else {
            index = (int)(y * image_width);
        }

        if (numcomps == 3) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b;

                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                index++;
            }
        } else if (numcomps == 4) {
            for (x = 0; x < image_width; x++) {
                unsigned char r, g, b, a;
                if (!fread(&b, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&g, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&r, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }
                if (!fread(&a, 1, 1, f)) {
                    fprintf(stderr,
                            "\nError: fread return a number of element different from the expected.\n");
                    opj_image_destroy(image);
                    fclose(f);
                    return NULL;
                }

                image->comps[0].data[index] = r;
                image->comps[1].data[index] = g;
                image->comps[2].data[index] = b;
                image->comps[3].data[index] = a;
                index++;
            }
        } else {
            fprintf(stderr, "Currently unsupported bit depth : %s\n", filename);
        }
    }
    fclose(f);
    return image;
}